

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall UnitTests::Assert::True(Assert *this,string *msg,bool expr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [39];
  undefined1 local_19;
  string *psStack_18;
  bool expr_local;
  string *msg_local;
  Assert *this_local;
  
  if (!expr) {
    local_19 = expr;
    psStack_18 = msg;
    msg_local = (string *)this;
    std::operator+(local_40,(char *)msg);
    Error(this,local_40);
  }
  return;
}

Assistant:

void True(const std::string& msg, bool expr) const
        {
            if (!expr)
            {
                Error(msg + " Expression evaluated to false");
            }
        }